

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore.cpp
# Opt level: O0

SemaphoreStatus ot::os::semaphore::SemaphoreOpen(string *aName,Semaphore *aSem)

{
  char *__name;
  sem_t *psVar1;
  undefined1 local_40 [8];
  string semName;
  Semaphore *aSem_local;
  string *aName_local;
  
  semName.field_2._8_8_ = aSem;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,"/",
                 aName);
  *(undefined8 *)semName.field_2._8_8_ = 0;
  __name = (char *)std::__cxx11::string::c_str();
  psVar1 = sem_open(__name,0x40,0x180,1);
  *(sem_t **)semName.field_2._8_8_ = psVar1;
  aName_local._4_4_ = (SemaphoreStatus)(*(long *)semName.field_2._8_8_ == 0);
  std::__cxx11::string::~string((string *)local_40);
  return aName_local._4_4_;
}

Assistant:

SemaphoreStatus SemaphoreOpen(std::string const &aName, Semaphore &aSem)
{
    std::string semName = "/" + aName;
    aSem.mPlatform      = nullptr;

    aSem.mPlatform = sem_open(semName.c_str(), O_CREAT, S_IWUSR | S_IRUSR, 1);
    if (aSem.mPlatform == SEM_FAILED)
    {
        return kError;
    }

    return kSuccess;
}